

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O0

double residual_norm_C(double *approximation,uint dimension,double *space_coordinate,
                      double time_upper_boundary,_func_double_double_double *approximated)

{
  double dVar1;
  double dVar2;
  uint local_3c;
  double dStack_38;
  uint space_step;
  double norm;
  _func_double_double_double *approximated_local;
  double time_upper_boundary_local;
  double *space_coordinate_local;
  uint dimension_local;
  double *approximation_local;
  
  dVar1 = *approximation;
  dVar2 = (*approximated)(*space_coordinate,time_upper_boundary);
  dStack_38 = ABS(dVar1 - dVar2);
  for (local_3c = 1; local_3c < dimension; local_3c = local_3c + 1) {
    dVar1 = approximation[local_3c];
    dVar2 = (*approximated)(space_coordinate[local_3c],time_upper_boundary);
    dStack_38 = max(ABS(dVar1 - dVar2),dStack_38);
  }
  return dStack_38;
}

Assistant:

double residual_norm_C (double const * approximation, 
                        unsigned dimension, 
                        double const * space_coordinate, 
                        double time_upper_boundary,
                        double (*approximated) (double, double)) {
  double norm = fabs (approximation[0] - approximated (space_coordinate[0], time_upper_boundary));
  unsigned space_step;
  for (space_step = 1; space_step < dimension; ++space_step) {
    norm = max (fabs (approximation[space_step] - approximated (space_coordinate[space_step], time_upper_boundary)), norm);
  }
  return norm;
}